

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,AuxiliaryStmt *stmt)

{
  process_stmt(this,&stmt->super_Stmt);
  return;
}

Assistant:

void visit(AuxiliaryStmt *stmt) override { process_stmt(stmt); }